

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_generate_mlsag
              (secp256k1_context *ctx,uint8_t *ki,uint8_t *pc,uint8_t *ps,uint8_t *nonce,
              uint8_t *preimage,size_t nCols,size_t nRows,size_t index,uint8_t **sk,uint8_t *pk)

{
  uint8_t *puVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  secp256k1_fe *rzr;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t len;
  size_t extraout_RDX_02;
  size_t extraout_RDX_03;
  size_t extraout_RDX_04;
  size_t extraout_RDX_05;
  size_t extraout_RDX_06;
  size_t len_00;
  ulong extraout_RDX_07;
  size_t extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  secp256k1_context *psVar6;
  secp256k1_scalar *psVar7;
  ulong uVar8;
  size_t sVar9;
  secp256k1_sha256 *psVar10;
  secp256k1_sha256 *psVar11;
  uchar *pub;
  ulong uVar12;
  byte bVar13;
  int overflow;
  size_t clen;
  secp256k1_context *local_910;
  ulong local_908;
  ulong local_900;
  uint8_t *local_8f8;
  ulong local_8f0;
  uint8_t *local_8e8;
  size_t local_8e0;
  uint8_t *local_8d8;
  secp256k1_ge ge1;
  secp256k1_scalar clast;
  secp256k1_scalar ss;
  secp256k1_gej gej1;
  uint8_t tmp [64];
  secp256k1_scalar s;
  secp256k1_scalar local_758;
  secp256k1_sha256 local_738;
  secp256k1_gej gej2;
  secp256k1_rfc6979_hmac_sha256 rng;
  secp256k1_gej L;
  secp256k1_pubkey pubkey;
  secp256k1_sha256 sha256_pre;
  secp256k1_gej R;
  secp256k1_scalar alpha [33];
  
  bVar13 = 0;
  iVar2 = 1;
  if ((((nRows < 0x22) && (local_8e0 = nCols, nCols != 0)) && (1 < nRows)) && (pk != (uint8_t *)0x0)
     ) {
    local_8f0 = nRows - 1;
    local_758.d[2] = 0;
    local_758.d[3] = 0;
    local_758.d[0] = 0;
    local_758.d[1] = 0;
    tmp._0_8_ = *(undefined8 *)nonce;
    tmp._8_8_ = *(undefined8 *)(nonce + 8);
    tmp._16_8_ = *(undefined8 *)(nonce + 0x10);
    tmp._24_8_ = *(undefined8 *)(nonce + 0x18);
    tmp._32_8_ = *(undefined8 *)preimage;
    tmp._40_8_ = *(undefined8 *)(preimage + 8);
    tmp._48_8_ = *(undefined8 *)(preimage + 0x10);
    tmp._56_8_ = *(undefined8 *)(preimage + 0x18);
    local_910 = ctx;
    local_8f8 = ps;
    local_8e8 = pc;
    local_8d8 = ki;
    secp256k1_rfc6979_hmac_sha256_initialize(&rng,tmp,0x40);
    local_738.s[0] = 0x6a09e667;
    local_738.s[1] = 0xbb67ae85;
    local_738.s[2] = 0x3c6ef372;
    local_738.s[3] = 0xa54ff53a;
    local_738.s[4] = 0x510e527f;
    local_738.s[5] = 0x9b05688c;
    local_738.s[6] = 0x1f83d9ab;
    local_738.s[7] = 0x5be0cd19;
    local_738.bytes = 0;
    secp256k1_sha256_write(&local_738,preimage,0x20);
    psVar10 = &local_738;
    psVar11 = &sha256_pre;
    for (lVar5 = 0xd; lVar5 != 0; lVar5 = lVar5 + -1) {
      *(undefined8 *)psVar11->s = *(undefined8 *)psVar10->s;
      psVar10 = (secp256k1_sha256 *)((long)psVar10 + (ulong)bVar13 * -0x10 + 8);
      psVar11 = (secp256k1_sha256 *)((long)psVar11 + (ulong)bVar13 * -0x10 + 8);
    }
    sVar9 = extraout_RDX;
    psVar6 = local_910;
    for (uVar12 = 0; uVar12 != local_8f0; uVar12 = uVar12 + 1) {
      psVar7 = alpha + uVar12;
      local_908 = uVar12;
      do {
        do {
          secp256k1_rfc6979_hmac_sha256_generate(&rng,tmp,sVar9);
          secp256k1_scalar_set_b32(psVar7,tmp,&overflow);
          sVar9 = extraout_RDX_00;
        } while (overflow != 0);
        iVar2 = secp256k1_scalar_is_zero(psVar7);
        sVar9 = extraout_RDX_01;
      } while (iVar2 != 0);
      iVar2 = secp256k1_ec_pubkey_create(psVar6,&pubkey,tmp);
      if (iVar2 == 0) goto LAB_00113655;
      clen = 0x21;
      iVar2 = secp256k1_ec_pubkey_serialize(psVar6,tmp,&clen,&pubkey,0x102);
      if (iVar2 == 0) goto LAB_00113655;
      if (clen != 0x21) {
        return 1;
      }
      lVar5 = local_908 * nCols;
      secp256k1_sha256_write(&local_738,pk + (lVar5 + index) * 0x21,0x21);
      secp256k1_sha256_write(&local_738,tmp,0x21);
      iVar2 = hash_to_curve(&ge1,pk + (lVar5 + index) * 0x21,len);
      if (iVar2 != 0) goto LAB_00113655;
      gej1.infinity = ge1.infinity;
      gej1.x.n[4] = ge1.x.n[4];
      gej1.x.n[2] = ge1.x.n[2];
      gej1.x.n[3] = ge1.x.n[3];
      gej1.x.n[0] = ge1.x.n[0];
      gej1.x.n[1] = ge1.x.n[1];
      gej1.y.n[4] = ge1.y.n[4];
      gej1.y.n[2] = ge1.y.n[2];
      gej1.y.n[3] = ge1.y.n[3];
      gej1.y.n[0] = ge1.y.n[0];
      gej1.y.n[1] = ge1.y.n[1];
      gej1.z.n[0] = 1;
      gej1.z.n._24_16_ = ZEXT816(0);
      gej1.z.n._8_16_ = ZEXT816(0);
      secp256k1_ecmult(&local_910->ecmult_ctx,&gej2,&gej1,psVar7,&local_758);
      secp256k1_ge_set_gej(&ge1,&gej2);
      secp256k1_eckey_pubkey_serialize(&ge1,tmp,&clen,1);
      secp256k1_sha256_write(&local_738,tmp,0x21);
      secp256k1_scalar_set_b32(&s,sk[local_908],&overflow);
      psVar6 = local_910;
      if (overflow != 0) {
        return 1;
      }
      if ((s.d[3] == 0 && s.d[1] == 0) && (s.d[2] == 0 && s.d[0] == 0)) {
        return 1;
      }
      secp256k1_ecmult(&local_910->ecmult_ctx,&gej2,&gej1,&s,&local_758);
      secp256k1_ge_set_gej(&ge1,&gej2);
      uVar12 = local_908;
      secp256k1_eckey_pubkey_serialize(&ge1,local_8d8 + local_908 * 0x21,&clen,1);
      sVar9 = extraout_RDX_02;
    }
    for (uVar12 = local_8f0; uVar12 < nRows; uVar12 = uVar12 + 1) {
      do {
        do {
          secp256k1_rfc6979_hmac_sha256_generate(&rng,tmp,sVar9);
          secp256k1_scalar_set_b32(alpha + uVar12,tmp,&overflow);
          sVar9 = extraout_RDX_03;
        } while (overflow != 0);
        iVar2 = secp256k1_scalar_is_zero(alpha + uVar12);
        psVar6 = local_910;
        sVar9 = extraout_RDX_04;
      } while (iVar2 != 0);
      iVar2 = secp256k1_ec_pubkey_create(local_910,&pubkey,tmp);
      if (iVar2 == 0) goto LAB_00113655;
      clen = 0x21;
      iVar2 = secp256k1_ec_pubkey_serialize(psVar6,tmp,&clen,&pubkey,0x102);
      if ((iVar2 == 0) || (clen != 0x21)) goto LAB_00113655;
      secp256k1_sha256_write(&local_738,pk + (uVar12 * nCols + index) * 0x21,0x21);
      secp256k1_sha256_write(&local_738,tmp,0x21);
      sVar9 = extraout_RDX_05;
    }
    secp256k1_sha256_finalize(&local_738,tmp);
    secp256k1_scalar_set_b32(&clast,tmp,&overflow);
    if (overflow == 0) {
      iVar2 = 1;
      if ((clast.d[3] != 0 || clast.d[1] != 0) || (clast.d[2] != 0 || clast.d[0] != 0)) {
        uVar12 = (index + 1) % nCols;
        if (uVar12 == 0) {
          *(undefined8 *)(local_8e8 + 0x10) = tmp._16_8_;
          *(undefined8 *)(local_8e8 + 0x18) = tmp._24_8_;
          *(undefined8 *)local_8e8 = tmp._0_8_;
          *(undefined8 *)(local_8e8 + 8) = tmp._8_8_;
        }
        local_900 = uVar12;
        while( true ) {
          lVar5 = 0xd;
          if (local_900 == index) break;
          psVar10 = &sha256_pre;
          psVar11 = &local_738;
          for (; lVar5 != 0; lVar5 = lVar5 + -1) {
            *(undefined8 *)psVar11->s = *(undefined8 *)psVar10->s;
            psVar10 = (secp256k1_sha256 *)((long)psVar10 + (ulong)bVar13 * -0x10 + 8);
            psVar11 = (secp256k1_sha256 *)((long)psVar11 + ((ulong)bVar13 * -2 + 1) * 8);
          }
          uVar4 = 0;
          while (uVar8 = local_8f0, uVar4 != local_8f0) {
            local_908 = uVar4;
            do {
              do {
                secp256k1_rfc6979_hmac_sha256_generate(&rng,tmp,uVar12);
                secp256k1_scalar_set_b32(&ss,tmp,&overflow);
                uVar12 = extraout_RDX_06;
              } while (overflow != 0);
            } while ((ss.d[3] == 0 && ss.d[1] == 0) && (ss.d[2] == 0 && ss.d[0] == 0));
            lVar5 = local_908 * nCols + local_900;
            lVar3 = lVar5 * 0x20;
            *(undefined8 *)(local_8f8 + lVar3 + 0x10) = tmp._16_8_;
            *(undefined8 *)(local_8f8 + lVar3 + 0x10 + 8) = tmp._24_8_;
            *(undefined8 *)(local_8f8 + lVar3) = tmp._0_8_;
            *(undefined8 *)(local_8f8 + lVar3 + 8) = tmp._8_8_;
            pub = pk + lVar5 * 0x21;
            iVar2 = secp256k1_eckey_pubkey_parse(&ge1,pub,0x21);
            if (iVar2 == 0) goto LAB_00113655;
            gej1.infinity = ge1.infinity;
            gej1.x.n[4] = ge1.x.n[4];
            gej1.x.n[2] = ge1.x.n[2];
            gej1.x.n[3] = ge1.x.n[3];
            gej1.x.n[0] = ge1.x.n[0];
            gej1.x.n[1] = ge1.x.n[1];
            gej1.y.n[4] = ge1.y.n[4];
            gej1.y.n[2] = ge1.y.n[2];
            gej1.y.n[3] = ge1.y.n[3];
            gej1.y.n[0] = ge1.y.n[0];
            gej1.y.n[1] = ge1.y.n[1];
            gej1.z.n[0] = 1;
            gej1.z.n._24_16_ = ZEXT816(0);
            gej1.z.n._8_16_ = ZEXT816(0);
            secp256k1_ecmult(&local_910->ecmult_ctx,&L,&gej1,&clast,&ss);
            iVar2 = hash_to_curve(&ge1,pub,len_00);
            if (iVar2 != 0) goto LAB_00113655;
            gej1.infinity = ge1.infinity;
            gej1.x.n[4] = ge1.x.n[4];
            gej1.x.n[2] = ge1.x.n[2];
            gej1.x.n[3] = ge1.x.n[3];
            gej1.x.n[0] = ge1.x.n[0];
            gej1.x.n[1] = ge1.x.n[1];
            gej1.y.n[4] = ge1.y.n[4];
            gej1.y.n[2] = ge1.y.n[2];
            gej1.y.n[3] = ge1.y.n[3];
            gej1.y.n[0] = ge1.y.n[0];
            gej1.y.n[1] = ge1.y.n[1];
            gej1.z.n[0] = 1;
            gej1.z.n._24_16_ = ZEXT816(0);
            gej1.z.n._8_16_ = ZEXT816(0);
            secp256k1_ecmult(&local_910->ecmult_ctx,&gej1,&gej1,&ss,&local_758);
            iVar2 = secp256k1_eckey_pubkey_parse(&ge1,local_8d8 + local_908 * 0x21,0x21);
            if (iVar2 == 0) goto LAB_00113655;
            gej2.infinity = ge1.infinity;
            gej2.x.n[4] = ge1.x.n[4];
            gej2.x.n[2] = ge1.x.n[2];
            gej2.x.n[3] = ge1.x.n[3];
            gej2.x.n[0] = ge1.x.n[0];
            gej2.x.n[1] = ge1.x.n[1];
            gej2.y.n[0] = ge1.y.n[0];
            gej2.y.n[1] = ge1.y.n[1];
            gej2.y.n[4] = ge1.y.n[4];
            gej2.y.n[2] = ge1.y.n[2];
            gej2.y.n[3] = ge1.y.n[3];
            gej2.z.n[0] = 1;
            gej2.z.n[3] = 0;
            gej2.z.n[4] = 0;
            gej2.z.n[1] = 0;
            gej2.z.n[2] = 0;
            rzr = (secp256k1_fe *)&clast;
            secp256k1_ecmult(&local_910->ecmult_ctx,&gej2,&gej2,(secp256k1_scalar *)rzr,&local_758);
            secp256k1_gej_add_var(&R,&gej1,&gej2,rzr);
            secp256k1_sha256_write(&local_738,pub,0x21);
            secp256k1_ge_set_gej(&ge1,&L);
            secp256k1_eckey_pubkey_serialize(&ge1,tmp,&clen,1);
            secp256k1_sha256_write(&local_738,tmp,0x21);
            secp256k1_ge_set_gej(&ge1,&R);
            secp256k1_eckey_pubkey_serialize(&ge1,tmp,&clen,1);
            secp256k1_sha256_write(&local_738,tmp,0x21);
            uVar12 = extraout_RDX_07;
            uVar4 = local_908 + 1;
          }
          for (; uVar8 < nRows; uVar8 = uVar8 + 1) {
            do {
              do {
                secp256k1_rfc6979_hmac_sha256_generate(&rng,tmp,uVar12);
                secp256k1_scalar_set_b32(&ss,tmp,&overflow);
                uVar12 = extraout_RDX_08;
              } while (overflow != 0);
            } while ((ss.d[3] == 0 && ss.d[1] == 0) && (ss.d[2] == 0 && ss.d[0] == 0));
            lVar5 = uVar8 * nCols + local_900;
            lVar3 = lVar5 * 0x20;
            *(undefined8 *)(local_8f8 + lVar3 + 0x10) = tmp._16_8_;
            *(undefined8 *)(local_8f8 + lVar3 + 0x10 + 8) = tmp._24_8_;
            *(undefined8 *)(local_8f8 + lVar3) = tmp._0_8_;
            *(undefined8 *)(local_8f8 + lVar3 + 8) = tmp._8_8_;
            iVar2 = secp256k1_eckey_pubkey_parse(&ge1,pk + lVar5 * 0x21,0x21);
            if (iVar2 == 0) goto LAB_00113655;
            gej1.infinity = ge1.infinity;
            gej1.x.n[4] = ge1.x.n[4];
            gej1.x.n[2] = ge1.x.n[2];
            gej1.x.n[3] = ge1.x.n[3];
            gej1.x.n[0] = ge1.x.n[0];
            gej1.x.n[1] = ge1.x.n[1];
            gej1.y.n[0] = ge1.y.n[0];
            gej1.y.n[1] = ge1.y.n[1];
            gej1.y.n[4] = ge1.y.n[4];
            gej1.y.n[2] = ge1.y.n[2];
            gej1.y.n[3] = ge1.y.n[3];
            gej1.z.n[0] = 1;
            gej1.z.n[3] = 0;
            gej1.z.n[4] = 0;
            gej1.z.n[1] = 0;
            gej1.z.n[2] = 0;
            secp256k1_ecmult(&local_910->ecmult_ctx,&L,&gej1,&clast,&ss);
            secp256k1_sha256_write(&local_738,pk + lVar5 * 0x21,0x21);
            secp256k1_ge_set_gej(&ge1,&L);
            secp256k1_eckey_pubkey_serialize(&ge1,tmp,&clen,1);
            secp256k1_sha256_write(&local_738,tmp,0x21);
            uVar12 = extraout_RDX_09;
          }
          secp256k1_sha256_finalize(&local_738,tmp);
          secp256k1_scalar_set_b32(&clast,tmp,&overflow);
          if (overflow != 0) {
            return 1;
          }
          if ((clast.d[3] == 0 && clast.d[1] == 0) && (clast.d[2] == 0 && clast.d[0] == 0)) {
            return 1;
          }
          uVar12 = local_900 + 1;
          local_900 = 0;
          if (uVar12 != nCols) {
            local_900 = uVar12;
          }
          uVar12 = extraout_RDX_10;
          if (local_900 == 0) {
            *(undefined8 *)(local_8e8 + 0x10) = tmp._16_8_;
            *(undefined8 *)(local_8e8 + 0x18) = tmp._24_8_;
            *(undefined8 *)local_8e8 = tmp._0_8_;
            *(undefined8 *)(local_8e8 + 8) = tmp._8_8_;
          }
        }
        local_8f8 = local_8f8 + index * 0x20;
        local_8e0 = local_8e0 << 5;
        psVar7 = alpha;
        for (sVar9 = 0; nRows != sVar9; sVar9 = sVar9 + 1) {
          secp256k1_scalar_set_b32(&ss,sk[sVar9],&overflow);
          if ((overflow != 0) || ((ss.d[3] == 0 && ss.d[1] == 0) && (ss.d[2] == 0 && ss.d[0] == 0)))
          goto LAB_00113655;
          secp256k1_scalar_mul(&s,&clast,&ss);
          secp256k1_scalar_negate(&s,&s);
          secp256k1_scalar_add(&ss,psVar7,&s);
          puVar1 = local_8f8;
          secp256k1_scalar_get_b32(local_8f8,&ss);
          psVar7 = psVar7 + 1;
          local_8f8 = puVar1 + local_8e0;
        }
        iVar2 = 0;
      }
    }
    else {
LAB_00113655:
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int secp256k1_generate_mlsag(const secp256k1_context *ctx,
    uint8_t *ki, uint8_t *pc, uint8_t *ps,
    const uint8_t *nonce, const uint8_t *preimage, size_t nCols,
    size_t nRows, size_t index, const uint8_t **sk, const uint8_t *pk)
{
    /* nRows == nInputs + 1, last row sums commitments
    */

    secp256k1_rfc6979_hmac_sha256 rng;
    secp256k1_sha256 sha256_m, sha256_pre;
    size_t dsRows = nRows-1; /* TODO: pass in dsRows explicitly? */
    /* secp256k1_scalar alpha[nRows]; */
    secp256k1_scalar alpha[MLSAG_MAX_ROWS]; /* To remove MLSAG_MAX_ROWS limit, malloc 32 * nRows for alpha  */
    secp256k1_scalar zero, clast, s, ss;
    secp256k1_pubkey pubkey;
    secp256k1_ge ge1;
    secp256k1_gej gej1, gej2, L, R;
    uint8_t tmp[32 + 32];
    size_t i, k, clen;
    int overflow;

    if (!pk
        || nRows < 2
        || nCols < 1
        || nRows > MLSAG_MAX_ROWS) {
        return 1;
    }

    secp256k1_scalar_set_int(&zero, 0);

    memcpy(tmp, nonce, 32);
    memcpy(tmp+32, preimage, 32);

    /* seed the random no. generator */
    secp256k1_rfc6979_hmac_sha256_initialize(&rng, tmp, 32 + 32);

    secp256k1_sha256_initialize(&sha256_m);
    secp256k1_sha256_write(&sha256_m, preimage, 32);
    sha256_pre = sha256_m;

    for (k = 0; k < dsRows; ++k) {
        do {
            secp256k1_rfc6979_hmac_sha256_generate(&rng, tmp, 32);
            secp256k1_scalar_set_b32(&alpha[k], tmp, &overflow);
        } while (overflow || secp256k1_scalar_is_zero(&alpha[k]));

        if (!secp256k1_ec_pubkey_create(ctx, &pubkey, tmp)) { /* G * alpha[col] */
            return 1;
        }
        clen = 33; /* must be set */
        if (!secp256k1_ec_pubkey_serialize(ctx, tmp, &clen, &pubkey, SECP256K1_EC_COMPRESSED)
            || clen != 33) {
            return 1;
        }

        secp256k1_sha256_write(&sha256_m, &pk[(index + k*nCols)*33], 33); /* pk_ind[col] */
        secp256k1_sha256_write(&sha256_m, tmp, 33); /* G * alpha[col] */

        if (0 != hash_to_curve(&ge1, &pk[(index + k*nCols)*33], 33)) { /* H(pk_ind[col]) */
            return 1;
        }

        secp256k1_gej_set_ge(&gej1, &ge1);
        secp256k1_ecmult(&ctx->ecmult_ctx, &gej2, &gej1, &alpha[k], &zero);  /* gej2 = H(pk_ind[col]) * alpha[col] */

        secp256k1_ge_set_gej(&ge1, &gej2);
        secp256k1_eckey_pubkey_serialize(&ge1, tmp, &clen, 1);
        secp256k1_sha256_write(&sha256_m, tmp, 33); /* H(pk_ind[col]) * alpha[col] */

        secp256k1_scalar_set_b32(&s, sk[k], &overflow);
        if (overflow || secp256k1_scalar_is_zero(&s)) {
            return 1;
        }
        secp256k1_ecmult(&ctx->ecmult_ctx, &gej2, &gej1, &s, &zero);  /* gej2 = H(pk_ind[col]) * sk_ind[col] */
        secp256k1_ge_set_gej(&ge1, &gej2);
        secp256k1_eckey_pubkey_serialize(&ge1, &ki[k * 33], &clen, 1);
    }

    for (k = dsRows; k < nRows; ++k) {
        do {
            secp256k1_rfc6979_hmac_sha256_generate(&rng, tmp, 32);
            secp256k1_scalar_set_b32(&alpha[k], tmp, &overflow);
        } while (overflow || secp256k1_scalar_is_zero(&alpha[k]));

        if (!secp256k1_ec_pubkey_create(ctx, &pubkey, tmp)) { /* G * alpha[col] */
            return 1;
        }
        clen = 33; /* must be set */
        if (!secp256k1_ec_pubkey_serialize(ctx, tmp, &clen, &pubkey, SECP256K1_EC_COMPRESSED)
            || clen != 33) {
            return 1;
        }
        secp256k1_sha256_write(&sha256_m, &pk[(index + k*nCols)*33], 33); /* pk_ind[col] */
        secp256k1_sha256_write(&sha256_m, tmp, 33); /* G * alpha[col] */
    }

    secp256k1_sha256_finalize(&sha256_m, tmp);
    secp256k1_scalar_set_b32(&clast, tmp, &overflow);
    if (overflow || secp256k1_scalar_is_zero(&clast)) {
        return 1;
    }

    i = (index + 1) % nCols;

    if (i == 0) {
        memcpy(pc, tmp, 32); /* *pc = clast */
    }

    while (i != index) {
        sha256_m = sha256_pre; /* set to after preimage hashed */

        for (k = 0; k < dsRows; ++k) {
            do {
                secp256k1_rfc6979_hmac_sha256_generate(&rng, tmp, 32);
                secp256k1_scalar_set_b32(&ss, tmp, &overflow);
            } while (overflow || secp256k1_scalar_is_zero(&ss));

            memcpy(&ps[(i + k*nCols)*32], tmp, 32);

            if (!secp256k1_eckey_pubkey_parse(&ge1, &pk[(i + k*nCols)*33], 33)) {
                return 1;
            }
            secp256k1_gej_set_ge(&gej1, &ge1);
            secp256k1_ecmult(&ctx->ecmult_ctx, &L, &gej1, &clast, &ss); /* L = G * ss + pk[k][i] * clast */


            /* R = H(pk[k][i]) * ss + ki[k] * clast */
            if (0 != hash_to_curve(&ge1, &pk[(i + k*nCols)*33], 33)) { /* H(pk[k][i]) */
                return 1;
            }
            secp256k1_gej_set_ge(&gej1, &ge1);
            secp256k1_ecmult(&ctx->ecmult_ctx, &gej1, &gej1, &ss, &zero); /* gej1 = H(pk[k][i]) * ss */

            if (!secp256k1_eckey_pubkey_parse(&ge1, &ki[k * 33], 33)) {
                return 1;
            }
            secp256k1_gej_set_ge(&gej2, &ge1);
            secp256k1_ecmult(&ctx->ecmult_ctx, &gej2, &gej2, &clast, &zero); /* gej2 = ki[k] * clast */

            secp256k1_gej_add_var(&R, &gej1, &gej2, NULL);  /* R =  gej1 + gej2 */

            secp256k1_sha256_write(&sha256_m, &pk[(i + k*nCols)*33], 33); /* pk[k][i] */
            secp256k1_ge_set_gej(&ge1, &L);
            secp256k1_eckey_pubkey_serialize(&ge1, tmp, &clen, 1);
            secp256k1_sha256_write(&sha256_m, tmp, 33); /* L */
            secp256k1_ge_set_gej(&ge1, &R);
            secp256k1_eckey_pubkey_serialize(&ge1, tmp, &clen, 1);
            secp256k1_sha256_write(&sha256_m, tmp, 33); /* R */
        }

        for (k = dsRows; k < nRows; ++k) {
            do {
                secp256k1_rfc6979_hmac_sha256_generate(&rng, tmp, 32);
                secp256k1_scalar_set_b32(&ss, tmp, &overflow);
            } while (overflow || secp256k1_scalar_is_zero(&ss));

            memcpy(&ps[(i + k*nCols)*32], tmp, 32);

            /* L = G * ss + pk[k][i] * clast */
            if (!secp256k1_eckey_pubkey_parse(&ge1, &pk[(i + k*nCols)*33], 33)) {
                return 1;
            }
            secp256k1_gej_set_ge(&gej1, &ge1);
            secp256k1_ecmult(&ctx->ecmult_ctx, &L, &gej1, &clast, &ss);

            secp256k1_sha256_write(&sha256_m, &pk[(i + k*nCols)*33], 33); /* pk[k][i] */
            secp256k1_ge_set_gej(&ge1, &L);
            secp256k1_eckey_pubkey_serialize(&ge1, tmp, &clen, 1);
            secp256k1_sha256_write(&sha256_m, tmp, 33); /* L */
        }

        secp256k1_sha256_finalize(&sha256_m, tmp);
        secp256k1_scalar_set_b32(&clast, tmp, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&clast)) {
            return 1;
        }
        i = (i + 1) % nCols;

        if (i == 0) {
            memcpy(pc, tmp, 32); /* *pc = clast */
        }
    }


    for (k = 0; k < nRows; ++k) {
        /* ss[k][index] = alpha[k] - clast * sk[k] */

        secp256k1_scalar_set_b32(&ss, sk[k], &overflow);
        if (overflow || secp256k1_scalar_is_zero(&ss)) {
            return 1;
        }
        secp256k1_scalar_mul(&s, &clast, &ss);

        secp256k1_scalar_negate(&s, &s);
        secp256k1_scalar_add(&ss, &alpha[k], &s);

        secp256k1_scalar_get_b32(&ps[(index + k*nCols)*32], &ss);
    }

    secp256k1_rfc6979_hmac_sha256_finalize(&rng);

    return 0;
}